

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::solve(HDual *this,HModel *ptr_model,int variant,int num_threads)

{
  HVector *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  HModel *pHVar9;
  uint uVar10;
  long lVar11;
  HPrimal hPrimal;
  
  this->dual_variant = variant;
  this->model = ptr_model;
  puts("model->mlFg_Report() 1");
  std::ostream::flush();
  HModel::mlFg_Report(this->model);
  std::ostream::flush();
  HVector::setup(&this->model->buffer,this->model->numRow);
  HVector::setup(&this->model->bufferLong,this->model->numCol);
  HModel::setup_for_solve(this->model);
  pHVar9 = this->model;
  pHVar9->problemStatus = -1;
  pHVar9->numberIteration = 0;
  this->totalRebuilds = 0;
  this->totalRebuildTime = 0.0;
  pHVar9->totalInverts = 0;
  pHVar9->totalInvertTime = 0.0;
  if (pHVar9->numRow != 0) {
    puts("model->mlFg_Report() 2");
    std::ostream::flush();
    HModel::mlFg_Report(this->model);
    std::ostream::flush();
    HTimer::reset(&this->model->timer);
    this->n_ph1_du_it = 0;
    this->n_ph2_du_it = 0;
    this->n_pr_it = 0;
    this->SolveBailout = false;
    if ((this->TimeLimitValue == 0.0) && (!NAN(this->TimeLimitValue))) {
      this->TimeLimitValue = 1000000.0;
      printf("Setting TimeLimitValue = %g\n",0);
    }
    init(this,(EVP_PKEY_CTX *)(ulong)(uint)num_threads);
    HModel::initCost(this->model,1);
    pHVar9 = this->model;
    if (pHVar9->mlFg_haveFreshInvert == 0) {
      HModel::computeFactor(pHVar9);
      pHVar9 = this->model;
    }
    if (pHVar9->mlFg_haveEdWt == 0) {
      if (this->EdWt_Mode == 0) {
        this->n_wg_DSE_wt = 0;
        uVar10 = this->numRow - pHVar9->numBasicLogicals;
        if ((uVar10 == 0 || this->numRow < pHVar9->numBasicLogicals) || (this->iz_DSE_wt != true)) {
          printf("solve:: %d basic structurals: starting from B=I so unit initial DSE weights\n",
                 (ulong)uVar10);
        }
        else {
          dVar5 = HTimer::getTime(&pHVar9->timer);
          this_00 = &this->row_ep;
          iVar8 = this->numRow;
          for (lVar11 = 0; lVar11 < iVar8; lVar11 = lVar11 + 1) {
            HVector::clear(this_00);
            (this->row_ep).count = 1;
            *(this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = (int)lVar11;
            (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] = 1.0;
            (this->row_ep).packFlag = false;
            HFactor::btran(this->factor,this_00,this->row_epDensity);
            dVar4 = HVector::norm2(this_00);
            (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] = dVar4;
            iVar8 = this->numRow;
            this->row_epDensity =
                 ((double)(this->row_ep).count * 0.05) / (double)iVar8 + this->row_epDensity * 0.95;
          }
          dVar4 = HTimer::getTime(&this->model->timer);
          printf("Computed %d initial DSE weights in %gs\n",(ulong)(uint)this->numRow);
          printf("solve:: %d basic structurals: computed %d initial DSE weights in %gs, %d, %d, %g\n"
                 ,SUB84(dVar4 - dVar5,0),dVar4 - dVar5,(ulong)uVar10,(ulong)(uint)this->numRow,
                 (ulong)uVar10,(ulong)(uint)this->numRow);
        }
      }
      else if (this->EdWt_Mode == 1) {
        this->n_dvx_fwk = 0;
        hPrimal.TimeLimitValue = (double)((ulong)hPrimal.TimeLimitValue & 0xffffffff00000000);
        std::vector<int,_std::allocator<int>_>::_M_fill_assign
                  (&this->dvx_ix,(long)this->numTot,(value_type *)&hPrimal);
        iz_dvx_fwk(this);
      }
      pHVar9 = this->model;
      pHVar9->mlFg_haveEdWt = 1;
    }
    HModel::computeDual(pHVar9);
    HModel::computeDualInfeasInDual(this->model,&this->dualInfeasCount);
    iVar8 = (this->dualInfeasCount < 1) + 1;
    this->solvePhase = iVar8;
    bVar6 = HModel::OKtoSolve(this->model,1,iVar8);
    if (!bVar6) {
      puts("NOT OK TO SOLVE???");
      std::ostream::flush();
    }
    iVar8 = this->solvePhase;
    pHVar9 = this->model;
    while (iVar8 != 0) {
      if (iVar8 != 4) {
        iVar7 = pHVar9->numberIteration;
        if (iVar8 == 2) {
          solve_phase2(this);
          pHVar9 = this->model;
          this->n_ph2_du_it = this->n_ph2_du_it + (pHVar9->numberIteration - iVar7);
        }
        else if (iVar8 == 1) {
          solve_phase1(this);
          pHVar9 = this->model;
          this->n_ph1_du_it = this->n_ph1_du_it + (pHVar9->numberIteration - iVar7);
        }
        else {
          this->solvePhase = 0;
        }
      }
      iVar8 = this->solvePhase;
      if ((iVar8 == 4) || ((this->SolveBailout & 1U) != 0)) break;
    }
    iVar8 = this->dual_variant;
    if (iVar8 == 0) {
      hPrimal.numCol = 0x14;
      hPrimal.numRow = 0x13;
      hPrimal.numTot = 0x15;
      hPrimal.limitUpdate = 0x16;
      hPrimal.totalRebuildTime = 2.75859452884773e-313;
      hPrimal.model = (HModel *)0x100000000e;
      hPrimal.TimeLimitValue = 2.12199579140993e-313;
      hPrimal.totalRebuilds = 0x11;
      hPrimal._12_4_ = 0x12;
      hPrimal.countUpdate = 0x17;
      hPrimal.invertHint = 0x18;
      HTimer::report(&pHVar9->timer,0xe,(int *)&hPrimal);
      iVar8 = this->dual_variant;
      pHVar9 = this->model;
    }
    if (iVar8 == 1) {
      hPrimal.countUpdate = 0x17;
      hPrimal.invertHint = 0x18;
      hPrimal.columnIn = 0;
      hPrimal.rowOut = 1;
      hPrimal.numCol = 0x14;
      hPrimal.numRow = 0x13;
      hPrimal.numTot = 0x15;
      hPrimal.limitUpdate = 0x16;
      hPrimal.totalRebuildTime = 2.75859452884773e-313;
      hPrimal.model = (HModel *)0x100000000e;
      hPrimal.TimeLimitValue = 2.12199579140993e-313;
      hPrimal.totalRebuilds = 0x11;
      hPrimal._12_4_ = 0x12;
      HTimer::report(&pHVar9->timer,0x10,(int *)&hPrimal);
      iVar8 = this->dual_variant;
      pHVar9 = this->model;
    }
    if (iVar8 == 2) {
      hPrimal.countUpdate = 0x17;
      hPrimal.invertHint = 0x18;
      hPrimal.columnIn = 0x19;
      hPrimal.numCol = 0x14;
      hPrimal.numRow = 0x13;
      hPrimal.numTot = 0x15;
      hPrimal.limitUpdate = 0x16;
      hPrimal.totalRebuildTime = 2.75859452884773e-313;
      hPrimal.model = (HModel *)0x100000000e;
      hPrimal.TimeLimitValue = 2.12199579140993e-313;
      hPrimal.totalRebuilds = 0x11;
      hPrimal._12_4_ = 0x12;
      HTimer::report(&pHVar9->timer,0xf,(int *)&hPrimal);
      pHVar9 = this->model;
      printf("PAMI   %-20s    CUTOFF  %6g    PERSISTENSE  %6g\n",SUB84(pHVar9->dblOption[4],0),
             (double)pHVar9->numberIteration / ((double)this->multi_iteration + 1.0),
             (pHVar9->modelName)._M_dataplus._M_p);
      pHVar9 = this->model;
    }
    if (pHVar9->problemStatus != 6) {
      iVar8 = pHVar9->numberIteration;
      iVar7 = iVar8;
      if (this->solvePhase == 4) {
        HPrimal::HPrimal(&hPrimal);
        hPrimal.TimeLimitValue = this->TimeLimitValue;
        HPrimal::solvePhase2(&hPrimal,this->model);
        this->totalRebuildTime = hPrimal.totalRebuildTime + this->totalRebuildTime;
        this->totalRebuilds = this->totalRebuilds + hPrimal.totalRebuilds;
        HPrimal::~HPrimal(&hPrimal);
        pHVar9 = this->model;
        iVar7 = pHVar9->numberIteration;
      }
      this->n_pr_it = this->n_pr_it + (iVar7 - iVar8);
    }
    dVar5 = HTimer::getTime(&pHVar9->timer);
    pHVar9 = this->model;
    pHVar9->totalTime = dVar5 + pHVar9->totalTime;
    uVar1 = this->n_ph1_du_it;
    uVar2 = this->n_ph2_du_it;
    uVar3 = this->n_pr_it;
    uVar10 = uVar2 + uVar1 + uVar3;
    if (uVar10 != pHVar9->numberIteration) {
      puts("Iteration total error ");
      uVar1 = this->n_ph1_du_it;
      uVar2 = this->n_ph2_du_it;
      uVar3 = this->n_pr_it;
      uVar10 = this->model->numberIteration;
    }
    printf("Iterations [Ph1 %d; Ph2 %d; Pr %d] Total %d\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
           (ulong)uVar10);
    if (this->EdWt_Mode == 1) {
      printf("Devex: n_dvx_fwk = %d; Average n_dvx_it = %d\n",(ulong)(uint)this->n_dvx_fwk,
             (long)this->model->numberIteration / (long)this->n_dvx_fwk & 0xffffffff);
    }
    bVar6 = HModel::OKtoSolve(this->model,1,this->solvePhase);
    if (!bVar6) {
      puts("NOT OK After Solve???");
      std::ostream::flush();
    }
    puts("model->mlFg_Report() 9");
    std::ostream::flush();
    HModel::mlFg_Report(this->model);
    std::ostream::flush();
    pHVar9 = this->model;
    printf("Time: Total inverts =  %4d; Total invert  time = %11.4g of Total time = %11.4g",
           SUB84(pHVar9->totalInvertTime,0),pHVar9->totalTime,(ulong)(uint)pHVar9->totalInverts);
    dVar5 = this->model->totalTime;
    if (dVar5 <= 0.001) {
      putchar(10);
    }
    else {
      printf(" (%6.2f%%)\n",SUB84((this->model->totalInvertTime * 100.0) / dVar5,0));
    }
    std::ostream::flush();
    printf("Time: Total rebuilds = %4d; Total rebuild time = %11.4g of Total time = %11.4g",
           SUB84(this->totalRebuildTime,0),this->model->totalTime,(ulong)(uint)this->totalRebuilds);
    dVar5 = this->model->totalTime;
    if (dVar5 <= 0.001) {
      putchar(10);
    }
    else {
      printf(" (%6.2f%%)\n",SUB84((this->totalRebuildTime * 100.0) / dVar5,0));
    }
    std::ostream::flush();
  }
  return;
}

Assistant:

void HDual::solve(HModel *ptr_model, int variant, int num_threads) {
  //  printf("\nEntering solve(HModel *ptr_model, int variant, int num_threads)\n");cout<<flush;
  assert(ptr_model != NULL);
  dual_variant = variant;
  model = ptr_model;
#ifdef JAJH_dev
  printf("model->mlFg_Report() 1\n");cout<<flush; model->mlFg_Report();cout<<flush;
#endif
  //  printf("HDual::solve - model->mlFg_Report() 1\n");cout<<flush; model->mlFg_Report();cout<<flush;
  // Setup two work buffers in model required for solve()
  model->buffer.setup(model->numRow);
  model->bufferLong.setup(model->numCol);
  
  //  printf("model->mlFg_haveEdWt 0 = %d\n", model->mlFg_haveEdWt);cout<<flush;
  
  // Setup aspects of the model data which are needed for solve() but better left until now for efficiency reasons.
  //  printf("HDual::solve - Calling model->setup_for_solve()\n");cout<<flush;
  model->setup_for_solve();
  
  //  printf("model->mlFg_haveEdWt 1 = %d\n", model->mlFg_haveEdWt);cout<<flush;

  model->problemStatus = LP_Status_Unset;
  model->numberIteration = 0;
  //Initialise numbers and times of rebuilds and inverts.
  totalRebuilds = 0;
  totalRebuildTime = 0;
  model->totalInverts = 0;
  model->totalInvertTime = 0;
  //Cannot solve box-constrained LPs
  if (model->numRow == 0) return;
#ifdef JAJH_dev
  printf("model->mlFg_Report() 2\n");cout<<flush; model->mlFg_Report();cout<<flush;
#endif

  model->timer.reset();

  n_ph1_du_it = 0;
  n_ph2_du_it = 0;
  n_pr_it = 0;
  //Set SolveBailout to be true if control is to be returned immediately to calling function
  SolveBailout = false;
  if (TimeLimitValue == 0) {
    TimeLimitValue = 1000000.0;
#ifdef JAJH_dev
    printf("Setting TimeLimitValue = %g\n", TimeLimitValue);
#endif
  }
  
  // Initialise working environment
  //Does LOTS, including initialisation of edge weights. Should only
  //be called if model dimension changes
  init(num_threads);
  
  model->initCost(1);
  if (!model->mlFg_haveFreshInvert) model->computeFactor();

  //Consider initialising edge weights
  //
  //NB workEdWt is assigned and initialised to 1s in
  //dualRHS.setup(model) so that CHUZR is well defined, even for
  //Dantzig pricing
  //
  //  printf("model->mlFg_haveEdWt 2 = %d\n", model->mlFg_haveEdWt);cout<<flush;
  if (!model->mlFg_haveEdWt) {
    //Edge weights are not known
    //Set up edge weights according to EdWt_Mode and iz_DSE_wt
    if (EdWt_Mode == EdWt_Mode_Dvx) {
      //Using dual Devex edge weights
      //Zero the number of Devex frameworks used and set up the first one
      n_dvx_fwk = 0;
      dvx_ix.assign(numTot, 0);
      iz_dvx_fwk();}
    else if (EdWt_Mode == EdWt_Mode_DSE) {
      //Using dual steepest edge (DSE) weights
#ifdef JAJH_dev
      n_wg_DSE_wt = 0;
#endif
      int numBasicStructurals = numRow - model->numBasicLogicals;
      if (numBasicStructurals > 0 && iz_DSE_wt) {
	//Basis is not logical and DSE weights are to be initialised
	//printf("Compute exct DSE weights\n");
	double IzDseEdWtTT = model->timer.getTime();
	for (int i = 0; i < numRow; i++) {
	  row_ep.clear();
	  row_ep.count = 1;
	  row_ep.index[0] = i;
	  row_ep.array[i] = 1;
	  row_ep.packFlag = false;
	  factor->btran(row_ep, row_epDensity);
	  dualRHS.workEdWt[i] = row_ep.norm2();
	  row_epDensity *= 0.95;
	  row_epDensity += 0.05 * row_ep.count / numRow;
	}
	IzDseEdWtTT = model->timer.getTime() - IzDseEdWtTT;
#ifdef JAJH_dev
	printf("Computed %d initial DSE weights in %gs\n", numRow, IzDseEdWtTT);
#endif
	printf("solve:: %d basic structurals: computed %d initial DSE weights in %gs, %d, %d, %g\n",
	numBasicStructurals, numRow, IzDseEdWtTT, numBasicStructurals, numRow, IzDseEdWtTT);
      } else {
	printf("solve:: %d basic structurals: starting from B=I so unit initial DSE weights\n", numBasicStructurals);
      }
    }
    //Indicate that edge weights are known
    model->mlFg_haveEdWt = 1;
  }
  //  printf("model->mlFg_haveEdWt 3 = %d\n", model->mlFg_haveEdWt);cout<<flush;
  
  model->computeDual();
  
  //  printf("Solve: Computed dual\n");cout<<flush;

#ifdef JAJH_dev
  bool rp_bs_cond = false;
  if (rp_bs_cond) {
    double bs_cond = an_bs_cond(ptr_model);
    printf("Initial basis condition estimate is %g\n", bs_cond);
  }
#endif
  
  //  printf("HDual::solve - Calling model->computeDualInfeasInDual\n");cout<<flush;
  model->computeDualInfeasInDual(&dualInfeasCount);
  solvePhase = dualInfeasCount > 0 ? 1 : 2;
  
  //  printf("Solve: Computed phase = %d\n", solvePhase);cout<<flush;

  // Find largest dual and adjust the dual tolerance accordingly
  double largeDual = 0;
  for (int i = 0; i < numTot; i++) {
    if (model->getNonbasicFlag()[i]) {
      double myDual = fabs(workDual[i] * jMove[i]);
      if (largeDual < myDual)
	largeDual = myDual;
    }
  }
  
  // Check that the model is OK to solve:
  //
  // Level 0 just checks the flags
  //
  // Level 1 also checks that the basis is OK and that the necessary
  // data in work* is populated.
  //
  // Level 2 (will) checks things like the nonbasic duals and basic
  // primal values
  //
  // Level 3 (will) checks expensive things like the INVERT and
  // steepeest edge weights
  //
  bool ok = model->OKtoSolve(1, solvePhase);
  if (!ok) {printf("NOT OK TO SOLVE???\n");cout<<flush;}
  //  assert(ok);
  
  //  rp_hsol_sol(ptr_model);


  //	Analyse the initial values of primal and dual variables
  //  an_iz_vr_v();
  
  // The major solving loop
  
  while (solvePhase) {
#ifdef JAJH_dev
    int it0 = model->numberIteration;
    //printf("HDual::solve Phase %d: Iteration %d; totalTime = %g; timer.getTime = %g\n", solvePhase, model->numberIteration, model->totalTime, model->timer.getTime());
#endif
    switch (solvePhase) {
    case 1:
      solve_phase1();
#ifdef JAJH_dev
      n_ph1_du_it += (model->numberIteration - it0);
#endif
      break;
    case 2:
      solve_phase2();
#ifdef JAJH_dev
      n_ph2_du_it += (model->numberIteration - it0);
#endif
      break;
    case 4:
      break;
    default:
      solvePhase = 0;
      break;
    }
    // Jump for primal
    if (solvePhase == 4)
      break;
    // Possibly bail out
    if (SolveBailout)
      break;
  }
  
#ifdef JAJH_dev
  // Report the ticks before primal
  if (dual_variant == HDUAL_VARIANT_PLAIN) {
    int reportList[] = { HTICK_INVERT, HTICK_CHUZR1, HTICK_BTRAN,
			 HTICK_PRICE, HTICK_CHUZC1, HTICK_CHUZC2, HTICK_CHUZC3,
			 HTICK_FTRAN, HTICK_FTRAN_MIX, HTICK_FTRAN_DSE,
			 HTICK_UPDATE_DUAL, HTICK_UPDATE_PRIMAL, HTICK_UPDATE_WEIGHT,
			 HTICK_UPDATE_FACTOR };
    int reportCount = sizeof(reportList) / sizeof(int);
    model->timer.report(reportCount, reportList);
  }
  
  if (dual_variant == HDUAL_VARIANT_TASKS) {
    int reportList[] = { HTICK_INVERT, HTICK_CHUZR1, HTICK_BTRAN,
			 HTICK_PRICE, HTICK_CHUZC1, HTICK_CHUZC2, HTICK_CHUZC3,
			 HTICK_FTRAN, HTICK_FTRAN_MIX, HTICK_FTRAN_DSE,
			 HTICK_UPDATE_DUAL, HTICK_UPDATE_PRIMAL, HTICK_UPDATE_WEIGHT,
			 HTICK_UPDATE_FACTOR, HTICK_GROUP1, HTICK_GROUP2 };
    int reportCount = sizeof(reportList) / sizeof(int);
    model->timer.report(reportCount, reportList);
  }
  
  if (dual_variant == HDUAL_VARIANT_MULTI) {
    int reportList[] = { HTICK_INVERT, HTICK_CHUZR1, HTICK_BTRAN,
			 HTICK_PRICE, HTICK_CHUZC1, HTICK_CHUZC2, HTICK_CHUZC3,
			 HTICK_FTRAN, HTICK_FTRAN_MIX, HTICK_FTRAN_DSE,
			 HTICK_UPDATE_DUAL, HTICK_UPDATE_PRIMAL, HTICK_UPDATE_WEIGHT,
			 HTICK_UPDATE_FACTOR, HTICK_UPDATE_ROW_EP };
    int reportCount = sizeof(reportList) / sizeof(int);
    model->timer.report(reportCount, reportList);
    printf("PAMI   %-20s    CUTOFF  %6g    PERSISTENSE  %6g\n",
	   model->modelName.c_str(), model->dblOption[DBLOPT_PAMI_CUTOFF],
	   model->numberIteration / (1.0 + multi_iteration));
  }
#endif
  
  if (model->problemStatus != LP_Status_OutOfTime) {
    // Use primal to clean up if not out of time
#ifdef JAJH_dev
    int it0 = model->numberIteration;
#endif
    if (solvePhase == 4) {
      HPrimal hPrimal;
      hPrimal.TimeLimitValue = TimeLimitValue;
      hPrimal.solvePhase2(model);
      //Add in the count and time for any primal rebuilds
      totalRebuildTime += hPrimal.totalRebuildTime;
      totalRebuilds += hPrimal.totalRebuilds;
    }
#ifdef JAJH_dev
    n_pr_it += (model->numberIteration - it0);
#endif
  }
  // Save the solved results
  model->totalTime += model->timer.getTime();
  
#ifdef JAJH_dev
  if (n_ph1_du_it + n_ph2_du_it + n_pr_it != model->numberIteration) {
    printf("Iteration total error \n");
  }
  printf("Iterations [Ph1 %d; Ph2 %d; Pr %d] Total %d\n", n_ph1_du_it,
  		n_ph2_du_it, n_pr_it, model->numberIteration);
  if (EdWt_Mode == EdWt_Mode_Dvx) {
    printf("Devex: n_dvx_fwk = %d; Average n_dvx_it = %d\n", n_dvx_fwk,
	   model->numberIteration / n_dvx_fwk);
  }
  if (rp_bs_cond) {
    double bs_cond = an_bs_cond(ptr_model);
    printf("Optimal basis condition estimate is %g\n", bs_cond);
    }
  //  rp_hsol_sol(ptr_model);
  ok = model->OKtoSolve(1, solvePhase);
  if (!ok) {printf("NOT OK After Solve???\n");cout<<flush;}
  //  assert(ok);
  printf("model->mlFg_Report() 9\n");cout<<flush;  model->mlFg_Report();cout<<flush;

  printf("Time: Total inverts =  %4d; Total invert  time = %11.4g of Total time = %11.4g", model->totalInverts, model->totalInvertTime, model->totalTime);
  if (model->totalTime > 0.001) 
    printf(" (%6.2f%%)\n", (100*model->totalInvertTime)/model->totalTime);
  else
    printf("\n");
  cout << flush;
  printf("Time: Total rebuilds = %4d; Total rebuild time = %11.4g of Total time = %11.4g", totalRebuilds, totalRebuildTime, model->totalTime);
  if (model->totalTime > 0.001) 
    printf(" (%6.2f%%)\n", (100*totalRebuildTime)/model->totalTime);
  else
    printf("\n");
  cout << flush;
 
#endif
}